

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

bool google::protobuf::internal::cpp::IsStringFieldWithPrivatizedAccessors(FieldDescriptor *field)

{
  byte bVar1;
  MessageLite *pMVar2;
  Nonnull<const_char_*> pcVar3;
  bool v1;
  
  if (((field->type_ == '\f') || (field->type_ == '\t')) &&
     (pMVar2 = ExtensionSet::GetMessage
                         (&(field->merged_features_->field_0)._impl_._extensions_,pb::cpp,
                          (MessageLite *)PTR__CppFeatures_default_instance__00470fa8),
     (int)pMVar2[1]._internal_metadata_.ptr_ == 2)) {
    if (field->type_ != '\f') {
      return true;
    }
    bVar1 = field->field_0x1;
    v1 = (bool)((bVar1 & 0x20) >> 5);
    if (0xbf < bVar1 == v1) {
      pcVar3 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                         (v1,0xbf < bVar1,
                          "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    }
    if (pcVar3 != (Nonnull<const_char_*>)0x0) {
      IsStringFieldWithPrivatizedAccessors();
    }
    if ((field->field_0x1 & 0x28) != 0) {
      return true;
    }
  }
  return false;
}

Assistant:

bool IsStringFieldWithPrivatizedAccessors(const FieldDescriptor& field) {
  // In open-source, protobuf CORD is only supported for singular bytes
  // fields.
  if (field.cpp_type() == FieldDescriptor::CPPTYPE_STRING &&
      InternalFeatureHelper::GetFeatures(field)
              .GetExtension(pb::cpp)
              .string_type() == pb::CppFeatures::CORD &&
      (field.type() != FieldDescriptor::TYPE_BYTES || field.is_repeated() ||
       field.is_extension())
  ) {
    return true;
  }

  return false;
}